

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChBody.cpp
# Opt level: O1

void __thiscall chrono::ChBody::RemoveAllMarkers(ChBody *this)

{
  pointer psVar1;
  shared_ptr<chrono::ChMarker> *marker;
  pointer psVar2;
  
  psVar2 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (this->marklist).
           super__Vector_base<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar2 != psVar1) {
    do {
      ((psVar2->super___shared_ptr<chrono::ChMarker,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->Body =
           (ChBody *)0x0;
      psVar2 = psVar2 + 1;
    } while (psVar2 != psVar1);
    std::
    vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
    clear(&this->marklist);
    return;
  }
  std::
  vector<std::shared_ptr<chrono::ChMarker>,_std::allocator<std::shared_ptr<chrono::ChMarker>_>_>::
  clear(&this->marklist);
  return;
}

Assistant:

void ChBody::RemoveAllMarkers() {
    for (auto& marker : marklist) {
        marker->SetBody(NULL);
    }
    marklist.clear();
}